

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_3e90a3a::DescriptorImpl::ExpandHelper
          (DescriptorImpl *this,int pos,SigningProvider *arg,DescriptorCache *read_cache,
          vector<CScript,_std::allocator<CScript>_> *output_scripts,FlatSigningProvider *out,
          DescriptorCache *write_cache)

{
  long lVar1;
  pointer puVar2;
  PubkeyProvider *pPVar3;
  pointer puVar4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  pointer __x;
  pointer puVar8;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *p;
  pointer puVar9;
  long in_FS_OFFSET;
  bool bVar10;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  vector<CScript,_std::allocator<CScript>_> subscripts;
  vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  entries;
  vector<CScript,_std::allocator<CScript>_> outscripts;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  CKeyID local_144;
  FlatSigningProvider subprovider;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entries.
  super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entries.
  super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  entries.
  super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>::
  reserve(&entries,(long)(this->m_pubkey_args).
                         super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_pubkey_args).
                         super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar9 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar9 == puVar2) {
      subscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      subscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      subscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
      subprovider.super_SigningProvider._vptr_SigningProvider =
           (_func_int **)&PTR__FlatSigningProvider_01158e68;
      subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
      subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
      subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
      subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      puVar8 = (this->m_subdescriptor_args).
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->m_subdescriptor_args).
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subprovider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subprovider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subprovider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subprovider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subprovider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      goto LAB_00ac53d6;
    }
    std::
    vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>::
    emplace_back<>(&entries);
    pPVar3 = (puVar9->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
             .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl;
    iVar7 = (*pPVar3->_vptr_PubkeyProvider[2])
                      (pPVar3,pos,arg,
                       entries.
                       super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1,
                       &entries.
                        super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].second,read_cache,write_cache
                      );
    puVar9 = puVar9 + 1;
  } while ((char)iVar7 != '\0');
  bVar10 = false;
  goto LAB_00ac55bf;
LAB_00ac53d6:
  bVar10 = puVar8 == puVar4;
  if (bVar10) goto LAB_00ac5468;
  outscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar6 = ExpandHelper((puVar8->_M_t).
                       super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                       .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                       _M_head_impl,pos,arg,read_cache,&outscripts,&subprovider,write_cache);
  if (!bVar6) {
    std::vector<CScript,_std::allocator<CScript>_>::~vector(&outscripts);
    goto LAB_00ac55a8;
  }
  if ((long)outscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)outscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("outscripts.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                  ,0x2d3,
                  "bool (anonymous namespace)::DescriptorImpl::ExpandHelper(int, const SigningProvider &, const DescriptorCache *, std::vector<CScript> &, FlatSigningProvider &, DescriptorCache *) const"
                 );
  }
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (&subscripts,
             outscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<CScript,_std::allocator<CScript>_>::~vector(&outscripts);
  puVar8 = puVar8 + 1;
  goto LAB_00ac53d6;
LAB_00ac5468:
  FlatSigningProvider::Merge(out,&subprovider);
  pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
            (&pubkeys,((long)entries.
                             super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)entries.
                            super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x68);
  ppVar5 = entries.
           super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = entries.
             super__Vector_base<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != ppVar5; __x = __x + 1) {
    std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back(&pubkeys,&__x->first);
    CPubKey::GetID(&local_144,&__x->first);
    memmove((pair<CPubKey,_KeyOriginInfo> *)&outscripts,__x,0x41);
    local_168._M_impl.super__Vector_impl_data._M_start =
         (__x->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_168._M_impl.super__Vector_impl_data._M_finish =
         (__x->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_168._M_impl.super__Vector_impl_data._M_end_of_storage =
         (__x->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__x->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__x->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__x->second).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
    ::_M_emplace_unique<CKeyID,std::pair<CPubKey,KeyOriginInfo>>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                *)&out->origins,&local_144,(pair<CPubKey,_KeyOriginInfo> *)&outscripts);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_168);
  }
  (*(this->super_Descriptor)._vptr_Descriptor[0x11])
            (&outscripts,this,&pubkeys,
             subscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)subscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)subscripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5,out);
  std::vector<CScript,_std::allocator<CScript>_>::_M_move_assign(output_scripts,&outscripts);
  std::vector<CScript,_std::allocator<CScript>_>::~vector(&outscripts);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
LAB_00ac55a8:
  FlatSigningProvider::~FlatSigningProvider(&subprovider);
  std::vector<CScript,_std::allocator<CScript>_>::~vector(&subscripts);
LAB_00ac55bf:
  std::
  vector<std::pair<CPubKey,_KeyOriginInfo>,_std::allocator<std::pair<CPubKey,_KeyOriginInfo>_>_>::
  ~vector(&entries);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool ExpandHelper(int pos, const SigningProvider& arg, const DescriptorCache* read_cache, std::vector<CScript>& output_scripts, FlatSigningProvider& out, DescriptorCache* write_cache) const
    {
        std::vector<std::pair<CPubKey, KeyOriginInfo>> entries;
        entries.reserve(m_pubkey_args.size());

        // Construct temporary data in `entries`, `subscripts`, and `subprovider` to avoid producing output in case of failure.
        for (const auto& p : m_pubkey_args) {
            entries.emplace_back();
            if (!p->GetPubKey(pos, arg, entries.back().first, entries.back().second, read_cache, write_cache)) return false;
        }
        std::vector<CScript> subscripts;
        FlatSigningProvider subprovider;
        for (const auto& subarg : m_subdescriptor_args) {
            std::vector<CScript> outscripts;
            if (!subarg->ExpandHelper(pos, arg, read_cache, outscripts, subprovider, write_cache)) return false;
            assert(outscripts.size() == 1);
            subscripts.emplace_back(std::move(outscripts[0]));
        }
        out.Merge(std::move(subprovider));

        std::vector<CPubKey> pubkeys;
        pubkeys.reserve(entries.size());
        for (auto& entry : entries) {
            pubkeys.push_back(entry.first);
            out.origins.emplace(entry.first.GetID(), std::make_pair<CPubKey, KeyOriginInfo>(CPubKey(entry.first), std::move(entry.second)));
        }

        output_scripts = MakeScripts(pubkeys, Span{subscripts}, out);
        return true;
    }